

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_LE_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_LE_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, LE)
{
    if( int x = 1 )
        ASSERT_LE(1, x) << x;
    if( int x = 1 )
        EXPECT_LE(1, x) << x;
    if( int x = 1 )
        INFORM_LE(1, x) << x;
    if( int x = 1 )
        ASSUME_LE(1, x) << x;
}